

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

void __thiscall
cimg_library::CImg<float>::CImg
          (CImg<float> *this,uint size_x,uint size_y,uint size_z,uint size_c,float *value)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  float *pfVar3;
  size_t siz;
  float *value_local;
  uint size_c_local;
  uint size_z_local;
  uint size_y_local;
  uint size_x_local;
  CImg<float> *this_local;
  
  this->_is_shared = false;
  uVar2 = (ulong)size_x * (ulong)size_y * (ulong)size_z * (ulong)size_c;
  if (uVar2 == 0) {
    this->_spectrum = 0;
    this->_depth = 0;
    this->_height = 0;
    this->_width = 0;
    this->_data = (float *)0x0;
  }
  else {
    this->_width = size_x;
    this->_height = size_y;
    this->_depth = size_z;
    this->_spectrum = size_c;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar2;
    uVar2 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    pfVar3 = (float *)operator_new__(uVar2);
    this->_data = pfVar3;
    fill(this,value);
  }
  return;
}

Assistant:

CImg(const unsigned int size_x, const unsigned int size_y,
         const unsigned int size_z, const unsigned int size_c, const T& value):
      _is_shared(false) {
      const size_t siz = (size_t)size_x*size_y*size_z*size_c;
      if (siz) {
        _width = size_x; _height = size_y; _depth = size_z; _spectrum = size_c;
        try { _data = new T[siz]; } catch (...) {
          _width = _height = _depth = _spectrum = 0; _data = 0;
          throw CImgInstanceException(_cimg_instance
                                      "CImg(): Failed to allocate memory (%s) for image (%u,%u,%u,%u).",
                                      cimg_instance,
                                      cimg::strbuffersize(sizeof(T)*size_x*size_y*size_z*size_c),
                                      size_x,size_y,size_z,size_c);
        }
        fill(value);
      } else { _width = _height = _depth = _spectrum = 0; _data = 0; }
    }